

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O3

void HttpReqThread::iter_body_table(vm_val_t *key,vm_val_t *val,void *ctx0)

{
  int iVar1;
  ushort *name;
  CVmDataSource *stream;
  ushort *puVar2;
  char *val_00;
  size_t mime_type_len;
  long lVar3;
  size_t filename_len;
  ushort *mime_type;
  char *def_ctype;
  vm_val_t file_val;
  vm_val_t fname_val;
  vm_val_t ctype_val;
  
  name = (ushort *)vm_val_t::get_as_string(key);
  if (name != (ushort *)0x0) {
    iVar1 = vm_val_t::is_instance_of(val,G_predef_X.file_upload_cl);
    if (iVar1 == 0) {
      val_00 = vm_val_t::cast_to_string(val,&file_val);
      if (val_00 != (char *)0x0) {
        OS_HttpPayload::add_tstr(*(OS_HttpPayload **)(*ctx0 + 0x80),(char *)name,val_00);
      }
    }
    else {
      CVmRun::get_prop(&G_interpreter_X,&file_val,val,G_predef_X.file_upload_fileObj,0,
                       *(vm_rcdesc **)((long)ctx0 + 8));
      CVmRun::get_prop(&G_interpreter_X,&ctype_val,val,G_predef_X.file_upload_contentType,0,
                       *(vm_rcdesc **)((long)ctx0 + 8));
      CVmRun::get_prop(&G_interpreter_X,&fname_val,val,G_predef_X.file_upload_filename,0,
                       *(vm_rcdesc **)((long)ctx0 + 8));
      def_ctype = (char *)0x0;
      stream = val_to_ds(&file_val,&def_ctype);
      puVar2 = (ushort *)vm_val_t::get_as_string(&ctype_val);
      mime_type = (ushort *)def_ctype;
      if (puVar2 == (ushort *)0x0) {
        mime_type_len = strlen(def_ctype);
      }
      else {
        mime_type_len = (size_t)*puVar2;
        mime_type = puVar2 + 1;
      }
      puVar2 = (ushort *)vm_val_t::get_as_string(&fname_val);
      if (puVar2 == (ushort *)0x0) {
        lVar3 = 0;
        filename_len = 0;
      }
      else {
        filename_len = (size_t)*puVar2;
        lVar3 = 2;
      }
      OS_HttpPayload::add(*(OS_HttpPayload **)(*ctx0 + 0x80),(char *)(name + 1),(ulong)*name,
                          (char *)((long)puVar2 + lVar3),filename_len,(char *)mime_type,
                          mime_type_len,stream);
    }
  }
  return;
}

Assistant:

static void iter_body_table(
        VMG_ const vm_val_t *key, const vm_val_t *val, void *ctx0)
    {
        /* get the context */
        iter_body_table_ctx *ctx = (iter_body_table_ctx *)ctx0;

        /* the key must be a string giving the field name */
        const char *field_name = key->get_as_string(vmg0_);
        if (field_name == 0)
            return;

        /* 
         *   the value must be either a string giving the simple form field
         *   value, or a FileUpload object giving a file to upload 
         */
        if (val->is_instance_of(vmg_ G_predef->file_upload_cl))
        {
            /* 
             *   It's a FileUpload object.  The 'file' property is the
             *   content object, which must be provided as a string or
             *   ByteArray; the 'filename' and 'contentType' properties are
             *   strings giving us details on how to treat the content data. 
             */

            /* retrieve the property values we're interested in */
            vm_val_t file_val, ctype_val, fname_val;
            G_interpreter->get_prop(
                vmg_ &file_val, val, G_predef->file_upload_fileObj, 0,
                ctx->rc);
            G_interpreter->get_prop(
                vmg_ &ctype_val, val, G_predef->file_upload_contentType, 0,
                ctx->rc);
            G_interpreter->get_prop(
                vmg_ &fname_val, val, G_predef->file_upload_filename, 0,
                ctx->rc);

            /* wrap the 'file' value in a datasource */
            const char *def_ctype = 0;
            CVmDataSource *src = val_to_ds(vmg_ &file_val, &def_ctype);

            /* if we have a contentType string, override the default */
            const char *ctype = ctype_val.get_as_string(vmg0_);
            size_t ctype_len;
            if (ctype != 0)
            {
                /* they specified a content type - use their value */
                ctype_len = vmb_get_len(ctype);
                ctype += VMB_LEN;
            }
            else
            {
                /* use the default */
                ctype = def_ctype;
                ctype_len = strlen(def_ctype);
            }

            /* get the filename string, if they provided one */
            const char *fname = fname_val.get_as_string(vmg0_);
            size_t fname_len = (fname != 0 ? vmb_get_len(fname) : 0);
            fname += (fname != 0 ? VMB_LEN : 0);

            /* add the field */
            ctx->self->body->add(
                field_name + VMB_LEN, vmb_get_len(field_name),
                fname, fname_len, ctype, ctype_len, src);
        }
        else
        {
            /* get a string interpretation of the value */
            vm_val_t new_str;
            const char *field_val = val->cast_to_string(vmg_ &new_str);
            if (field_val == 0)
                return;

            /* add the field to the payload */
            ctx->self->body->add_tstr(field_name, field_val);
        }
    }